

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

CBlockIndex * __thiscall Chainstate::FindForkInGlobalIndex(Chainstate *this,CBlockLocator *locator)

{
  long lVar1;
  pointer puVar2;
  pointer ppCVar3;
  bool bVar4;
  CBlockIndex *pindex;
  CBlockIndex *pCVar5;
  uint256 *hash;
  pointer hash_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (hash_00 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start; hash_00 != puVar2; hash_00 = hash_00 + 1) {
    pindex = ::node::BlockManager::LookupBlockIndex(this->m_blockman,hash_00);
    if (pindex != (CBlockIndex *)0x0) {
      bVar4 = CChain::Contains(&this->m_chain,pindex);
      if (bVar4) goto LAB_0035a56d;
      pCVar5 = CBlockIndex::GetAncestor
                         (pindex,(int)((ulong)((long)(this->m_chain).vChain.
                                                                                                          
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->m_chain).vChain.
                                                                                                        
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                 -1);
      ppCVar3 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar3 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        if (pCVar5 == (CBlockIndex *)0x0) goto LAB_0035a56a;
      }
      else {
        pindex = ppCVar3[-1];
        if (pCVar5 == pindex) goto LAB_0035a56d;
      }
    }
  }
  ppCVar3 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppCVar3) {
LAB_0035a56a:
    pindex = (CBlockIndex *)0x0;
  }
  else {
    pindex = *ppCVar3;
  }
LAB_0035a56d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pindex;
}

Assistant:

const CBlockIndex* Chainstate::FindForkInGlobalIndex(const CBlockLocator& locator) const
{
    AssertLockHeld(cs_main);

    // Find the latest block common to locator and chain - we expect that
    // locator.vHave is sorted descending by height.
    for (const uint256& hash : locator.vHave) {
        const CBlockIndex* pindex{m_blockman.LookupBlockIndex(hash)};
        if (pindex) {
            if (m_chain.Contains(pindex)) {
                return pindex;
            }
            if (pindex->GetAncestor(m_chain.Height()) == m_chain.Tip()) {
                return m_chain.Tip();
            }
        }
    }
    return m_chain.Genesis();
}